

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O0

void gdImageFlipVertical(gdImagePtr im)

{
  uchar uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  uchar p_1;
  int p;
  int *row_src;
  int *row_dst;
  int y;
  int x;
  gdImagePtr im_local;
  
  if (im->trueColor == 0) {
    for (row_dst._0_4_ = 0; (int)row_dst < im->sy / 2; row_dst._0_4_ = (int)row_dst + 1) {
      for (row_dst._4_4_ = 0; row_dst._4_4_ < im->sx; row_dst._4_4_ = row_dst._4_4_ + 1) {
        uVar1 = im->pixels[(int)row_dst][row_dst._4_4_];
        im->pixels[(int)row_dst][row_dst._4_4_] =
             im->pixels[(im->sy + -1) - (int)row_dst][row_dst._4_4_];
        im->pixels[(im->sy + -1) - (int)row_dst][row_dst._4_4_] = uVar1;
      }
    }
  }
  else {
    for (row_dst._0_4_ = 0; (int)row_dst < im->sy / 2; row_dst._0_4_ = (int)row_dst + 1) {
      piVar3 = im->tpixels[(int)row_dst];
      piVar4 = im->tpixels[(im->sy + -1) - (int)row_dst];
      for (row_dst._4_4_ = 0; row_dst._4_4_ < im->sx; row_dst._4_4_ = row_dst._4_4_ + 1) {
        iVar2 = piVar3[row_dst._4_4_];
        piVar3[row_dst._4_4_] = im->tpixels[(im->sy + -1) - (int)row_dst][row_dst._4_4_];
        piVar4[row_dst._4_4_] = iVar2;
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->pixels[y][x];
				im->pixels[y][x] =	im->pixels[im->sy - 1 - y][x];
				im->pixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}